

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnboundedLiteral::evalImpl(UnboundedLiteral *this,EvalContext *context)

{
  bool bVar1;
  size_type sVar2;
  EvalContext *in_RDX;
  ConstantValue *in_RDI;
  int32_t size;
  ConstantValue *target;
  bitmask<slang::ast::EvalFlags> *in_stack_ffffffffffffff98;
  SVInt *integer;
  ConstantValue *in_stack_ffffffffffffffa0;
  bitmask<slang::ast::EvalFlags> *this_00;
  bitwidth_t bits;
  ConstantValue *this_01;
  SVInt local_38;
  undefined4 local_28;
  bitmask<slang::ast::EvalFlags> local_21;
  ConstantValue *local_20;
  EvalContext *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  local_20 = EvalContext::getQueueTarget(in_RDX);
  if (local_20 == (ConstantValue *)0x0) {
    this_00 = &local_18->flags;
    bitmask<slang::ast::EvalFlags>::bitmask(&local_21,AllowUnboundedPlaceholder);
    bVar1 = bitmask<slang::ast::EvalFlags>::has(this_00,in_stack_ffffffffffffff98);
    if (bVar1) {
      slang::ConstantValue::ConstantValue(in_RDI);
    }
    else {
      slang::ConstantValue::ConstantValue((ConstantValue *)this_00,in_stack_ffffffffffffff98);
    }
  }
  else {
    slang::ConstantValue::queue((ConstantValue *)0x9fca62);
    bits = (bitwidth_t)((ulong)in_RDI >> 0x20);
    CopyPtr<slang::SVQueue>::operator->((CopyPtr<slang::SVQueue> *)0x9fca6a);
    sVar2 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       0x9fca72);
    local_28 = (undefined4)sVar2;
    integer = &local_38;
    SVInt::SVInt((SVInt *)this_01,bits,(uint64_t)in_stack_ffffffffffffffa0,
                 SUB81((ulong)integer >> 0x38,0));
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffffa0,integer);
    SVInt::~SVInt((SVInt *)this_01);
  }
  return this_01;
}

Assistant:

ConstantValue UnboundedLiteral::evalImpl(EvalContext& context) const {
    // If we're evaluating in a context with a queue target expression, use the
    // max bound of that queue. Otherwise assume we're assigning to a constant (parameter)
    // and use a placeholder value to indicate that.
    auto target = context.getQueueTarget();
    if (!target) {
        if (context.flags.has(EvalFlags::AllowUnboundedPlaceholder))
            return ConstantValue::UnboundedPlaceholder{};
        return nullptr;
    }

    int32_t size = (int32_t)target->queue()->size();
    return SVInt(32, uint64_t(size - 1), true);
}